

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_split
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,ObjectSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  PrimRef *pPVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  PrimRef *pPVar22;
  PrimRef *pPVar23;
  uint uVar24;
  ulong unaff_RBP;
  PrimRef *pPVar25;
  unsigned_long uVar26;
  int iVar27;
  uint uVar28;
  ulong unaff_R15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  pair<unsigned_long,_unsigned_long> pVar58;
  
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar6 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  iVar14 = (split->field_2).pos;
  auVar1 = *(undefined1 (*) [16])(mm_lookupmask_ps + (1L << ((byte)split->dim & 0x3f)) * 0x10);
  pPVar7 = this->prims0;
  pPVar25 = pPVar7 + uVar5;
  uVar21 = 0;
  uVar20 = 0;
  pPVar22 = pPVar7 + uVar6;
  aVar29 = _DAT_01feba00;
  aVar30 = _DAT_01feb9f0;
  aVar31 = _DAT_01feba00;
  aVar32 = _DAT_01feb9f0;
  aVar33 = _DAT_01feb9f0;
  aVar34 = _DAT_01feba00;
  aVar35 = _DAT_01feb9f0;
  aVar36 = _DAT_01feba00;
  do {
    uVar28 = (uint)unaff_R15;
    pPVar23 = pPVar22 + -1;
    if (pPVar25 <= pPVar23) {
      do {
        uVar28 = (uint)unaff_R15;
        aVar2 = (pPVar25->lower).field_0.field_1;
        aVar3 = (pPVar25->upper).field_0.field_1;
        fVar50 = aVar2.x + aVar3.x;
        fVar52 = aVar2.y + aVar3.y;
        fVar54 = aVar2.z + aVar3.z;
        fVar56 = aVar2.field_3.w + aVar3.field_3.w;
        auVar37._0_4_ =
             -(uint)((int)((fVar50 - (split->mapping).ofs.field_0.v[0]) *
                           (split->mapping).scale.field_0.v[0] + -0.5) < iVar14);
        auVar37._4_4_ =
             -(uint)((int)((fVar52 - (split->mapping).ofs.field_0.v[1]) *
                           (split->mapping).scale.field_0.v[1] + -0.5) < iVar14);
        auVar37._8_4_ =
             -(uint)((int)((fVar54 - (split->mapping).ofs.field_0.v[2]) *
                           (split->mapping).scale.field_0.v[2] + -0.5) < iVar14);
        auVar37._12_4_ =
             -(uint)((int)((fVar56 - (split->mapping).ofs.field_0.v[3]) *
                           (split->mapping).scale.field_0.v[3] + -0.5) < iVar14);
        uVar24 = movmskps((int)unaff_RBP,auVar37 & auVar1);
        unaff_RBP = (ulong)uVar24;
        if (uVar24 == 0) break;
        uVar28 = (uint)(pPVar25->lower).field_0.m128[3] >> 0x1b;
        unaff_R15 = (ulong)uVar28;
        aVar33.m128 = (__m128)minps(aVar33.m128,(undefined1  [16])aVar2);
        aVar34.m128 = (__m128)maxps(aVar34.m128,(undefined1  [16])aVar3);
        auVar11._4_4_ = fVar52;
        auVar11._0_4_ = fVar50;
        auVar11._8_4_ = fVar54;
        auVar11._12_4_ = fVar56;
        aVar35.m128 = (__m128)minps(aVar35.m128,auVar11);
        auVar12._4_4_ = fVar52;
        auVar12._0_4_ = fVar50;
        auVar12._8_4_ = fVar54;
        auVar12._12_4_ = fVar56;
        aVar36.m128 = (__m128)maxps(aVar36.m128,auVar12);
        uVar20 = uVar20 + unaff_R15;
        pPVar25 = pPVar25 + 1;
      } while (pPVar25 <= pPVar23);
    }
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),pPVar23 < pPVar25);
    if (pPVar23 < pPVar25) {
LAB_0018a502:
      uVar26 = (long)pPVar25 - (long)pPVar7 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar33;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar34;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar35;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar36;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar5;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar26;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar26;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar32;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar31;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar30;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar29;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar26;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar6;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar6;
      pVar58.second = uVar21;
      pVar58.first = uVar20;
      return pVar58;
    }
    fVar50 = (split->mapping).ofs.field_0.v[0];
    fVar52 = (split->mapping).ofs.field_0.v[1];
    fVar54 = (split->mapping).ofs.field_0.v[2];
    fVar56 = (split->mapping).ofs.field_0.v[3];
    fVar15 = (split->mapping).scale.field_0.v[0];
    fVar16 = (split->mapping).scale.field_0.v[1];
    fVar17 = (split->mapping).scale.field_0.v[2];
    fVar18 = (split->mapping).scale.field_0.v[3];
    fVar46 = pPVar22[-1].lower.field_0.m128[0];
    fVar47 = pPVar22[-1].lower.field_0.m128[1];
    fVar48 = pPVar22[-1].lower.field_0.m128[2];
    fVar49 = pPVar22[-1].lower.field_0.m128[3];
    fVar51 = pPVar22[-1].upper.field_0.m128[0];
    fVar53 = pPVar22[-1].upper.field_0.m128[1];
    fVar55 = pPVar22[-1].upper.field_0.m128[2];
    fVar57 = pPVar22[-1].upper.field_0.m128[3];
    fVar42 = fVar46 + fVar51;
    fVar43 = fVar47 + fVar53;
    fVar44 = fVar48 + fVar55;
    fVar45 = fVar49 + fVar57;
    auVar38._0_4_ = -(uint)((int)((fVar42 - fVar50) * fVar15 + -0.5) < iVar14);
    auVar38._4_4_ = -(uint)((int)((fVar43 - fVar52) * fVar16 + -0.5) < iVar14);
    auVar38._8_4_ = -(uint)((int)((fVar44 - fVar54) * fVar17 + -0.5) < iVar14);
    auVar38._12_4_ = -(uint)((int)((fVar45 - fVar56) * fVar18 + -0.5) < iVar14);
    uVar28 = movmskps(uVar28,auVar38 & auVar1);
    unaff_R15 = (ulong)uVar28;
    if (uVar28 == 0) {
      uVar26 = uVar21;
      pPVar22 = pPVar22 + -2;
      do {
        pPVar23 = pPVar22;
        auVar13._4_4_ = fVar53;
        auVar13._0_4_ = fVar51;
        auVar13._8_4_ = fVar55;
        auVar13._12_4_ = fVar57;
        aVar31.m128 = (__m128)maxps(aVar31.m128,auVar13);
        auVar10._4_4_ = fVar47;
        auVar10._0_4_ = fVar46;
        auVar10._8_4_ = fVar48;
        auVar10._12_4_ = fVar49;
        aVar32.m128 = (__m128)minps(aVar32.m128,auVar10);
        uVar21 = ((uint)pPVar23[1].lower.field_0.m128[3] >> 0x1b) + uVar26;
        auVar8._4_4_ = fVar43;
        auVar8._0_4_ = fVar42;
        auVar8._8_4_ = fVar44;
        auVar8._12_4_ = fVar45;
        aVar30.m128 = (__m128)minps(aVar30.m128,auVar8);
        auVar9._4_4_ = fVar43;
        auVar9._0_4_ = fVar42;
        auVar9._8_4_ = fVar44;
        auVar9._12_4_ = fVar45;
        aVar29.m128 = (__m128)maxps(aVar29.m128,auVar9);
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),pPVar23 < pPVar25);
        if (pPVar23 < pPVar25) goto LAB_0018a502;
        fVar46 = (pPVar23->lower).field_0.m128[0];
        fVar47 = (pPVar23->lower).field_0.m128[1];
        fVar48 = (pPVar23->lower).field_0.m128[2];
        fVar49 = (pPVar23->lower).field_0.m128[3];
        fVar51 = (pPVar23->upper).field_0.m128[0];
        fVar53 = (pPVar23->upper).field_0.m128[1];
        fVar55 = (pPVar23->upper).field_0.m128[2];
        fVar57 = (pPVar23->upper).field_0.m128[3];
        fVar42 = fVar46 + fVar51;
        fVar43 = fVar47 + fVar53;
        fVar44 = fVar48 + fVar55;
        fVar45 = fVar49 + fVar57;
        auVar39._0_4_ = -(uint)((int)((fVar42 - fVar50) * fVar15 + -0.5) < iVar14);
        auVar39._4_4_ = -(uint)((int)((fVar43 - fVar52) * fVar16 + -0.5) < iVar14);
        auVar39._8_4_ = -(uint)((int)((fVar44 - fVar54) * fVar17 + -0.5) < iVar14);
        auVar39._12_4_ = -(uint)((int)((fVar45 - fVar56) * fVar18 + -0.5) < iVar14);
        iVar27 = movmskps((int)uVar26,auVar39 & auVar1);
        uVar26 = uVar21;
        pPVar22 = pPVar23 + -1;
      } while (iVar27 == 0);
    }
    if ((char)unaff_RBP != '\0') goto LAB_0018a502;
    aVar2 = (pPVar23->lower).field_0.field_1;
    aVar3 = (pPVar23->upper).field_0.field_1;
    aVar33.m128 = (__m128)minps(aVar33.m128,(undefined1  [16])aVar2);
    aVar34.m128 = (__m128)maxps(aVar34.m128,(undefined1  [16])aVar3);
    auVar40._0_4_ = aVar3.x + aVar2.x;
    auVar40._4_4_ = aVar3.y + aVar2.y;
    auVar40._8_4_ = aVar3.z + aVar2.z;
    auVar40._12_4_ = aVar3.field_3.w + aVar2.field_3.w;
    aVar35.m128 = (__m128)minps(aVar35.m128,auVar40);
    aVar36.m128 = (__m128)maxps(aVar36.m128,auVar40);
    uVar20 = uVar20 + ((uint)(pPVar23->lower).field_0.m128[3] >> 0x1b);
    fVar50 = (pPVar25->lower).field_0.m128[3];
    aVar3 = (pPVar25->lower).field_0.field_1;
    aVar4 = (pPVar25->upper).field_0.field_1;
    aVar32.m128 = (__m128)minps(aVar32.m128,(undefined1  [16])aVar3);
    aVar31.m128 = (__m128)maxps(aVar31.m128,(undefined1  [16])aVar4);
    (pPVar25->lower).field_0.field_1 = aVar2;
    uVar19 = *(undefined8 *)((long)&(pPVar23->upper).field_0 + 8);
    *(undefined8 *)&(pPVar25->upper).field_0 = *(undefined8 *)&(pPVar23->upper).field_0;
    *(undefined8 *)((long)&(pPVar25->upper).field_0 + 8) = uVar19;
    (pPVar23->lower).field_0.field_1 = aVar3;
    auVar41._0_4_ = aVar3.x + aVar4.x;
    auVar41._4_4_ = aVar3.y + aVar4.y;
    auVar41._8_4_ = aVar3.z + aVar4.z;
    auVar41._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
    aVar30.m128 = (__m128)minps(aVar30.m128,auVar41);
    aVar29.m128 = (__m128)maxps(aVar29.m128,auVar41);
    uVar21 = uVar21 + ((uint)fVar50 >> 0x1b);
    (pPVar23->upper).field_0.field_1 = aVar4;
    pPVar25 = pPVar25 + 1;
    pPVar22 = pPVar23;
  } while( true );
}

Assistant:

std::pair<size_t,size_t> sequential_object_split(const ObjectSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          const typename ObjectBinner::vint vSplitPos(splitPos);
          const typename ObjectBinner::vbool vSplitMask(splitDimMask);
          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) { 
                                                return split.mapping.bin_unsafe(ref,vSplitPos,vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });          
          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);

          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }